

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O0

int __thiscall crnlib::console::vprintf(console *this,char *__format,__gnuc_va_list __arg)

{
  console_output_func p_Var1;
  bool bVar2;
  data_stream *this_00;
  bool bVar3;
  uint uVar4;
  int extraout_EAX;
  console_func *pcVar5;
  size_t sVar6;
  char *pcVar7;
  eConsoleMessageType eVar8;
  char *pcVar9;
  bool local_10a2;
  bool local_10a1;
  undefined1 local_1060 [8];
  dynamic_string tmp_buf;
  char *pcStack_1048;
  uint n;
  char *pPrefix;
  uint i;
  bool handled;
  char local_1028 [8];
  char buf [4096];
  scoped_mutex lock;
  __va_list_tag *args_local;
  char *p_local;
  eConsoleMessageType type_local;
  
  eVar8 = (eConsoleMessageType)this;
  init((EVP_PKEY_CTX *)this);
  scoped_mutex::scoped_mutex((scoped_mutex *)(buf + 0xff8),m_pMutex);
  *(int *)(m_num_messages + ((ulong)this & 0xffffffff) * 4) =
       *(int *)(m_num_messages + ((ulong)this & 0xffffffff) * 4) + 1;
  vsprintf_s(local_1028,0x1000,__format,(__va_list_tag *)__arg);
  bVar2 = false;
  uVar4 = vector<crnlib::console::console_func>::size
                    ((vector<crnlib::console::console_func> *)m_output_funcs);
  if (uVar4 != 0) {
    for (pPrefix._4_4_ = 0;
        uVar4 = vector<crnlib::console::console_func>::size
                          ((vector<crnlib::console::console_func> *)m_output_funcs),
        pPrefix._4_4_ < uVar4; pPrefix._4_4_ = pPrefix._4_4_ + 1) {
      pcVar5 = vector<crnlib::console::console_func>::operator[]
                         ((vector<crnlib::console::console_func> *)m_output_funcs,pPrefix._4_4_);
      p_Var1 = pcVar5->m_func;
      pcVar5 = vector<crnlib::console::console_func>::operator[]
                         ((vector<crnlib::console::console_func> *)m_output_funcs,pPrefix._4_4_);
      bVar3 = (*p_Var1)(eVar8,local_1028,pcVar5->m_pData);
      if (bVar3) {
        bVar2 = true;
      }
    }
  }
  pcStack_1048 = (char *)0x0;
  if (((m_prefixes & 1) != 0) && ((m_at_beginning_of_line & 1) != 0)) {
    if (eVar8 == cDebugConsoleMessage) {
      pcStack_1048 = "Debug: ";
    }
    else if (eVar8 == cWarningConsoleMessage) {
      pcStack_1048 = "Warning: ";
    }
    else if (eVar8 == cErrorConsoleMessage) {
      pcStack_1048 = "Error: ";
    }
  }
  if (((m_output_disabled & 1) == 0) && (!bVar2)) {
    if (pcStack_1048 != (char *)0x0) {
      ::printf("%s",pcStack_1048);
    }
    pcVar9 = "%s";
    if ((m_crlf & 1) != 0) {
      pcVar9 = "%s\n";
    }
    ::printf(pcVar9,local_1028);
  }
  sVar6 = strlen(local_1028);
  tmp_buf.m_pStr._4_4_ = (int)sVar6;
  local_10a1 = true;
  if ((m_crlf & 1) == 0) {
    local_10a2 = false;
    if (tmp_buf.m_pStr._4_4_ != 0) {
      local_10a2 = local_1028[tmp_buf.m_pStr._4_4_ - 1] == '\n';
    }
    local_10a1 = local_10a2;
  }
  m_at_beginning_of_line = local_10a1;
  if ((eVar8 != cProgressConsoleMessage) && (m_pLog_stream != (data_stream *)0x0)) {
    dynamic_string::dynamic_string((dynamic_string *)local_1060,local_1028);
    dynamic_string::translate_lf_to_crlf((dynamic_string *)local_1060);
    this_00 = m_pLog_stream;
    pcVar9 = "%s";
    if ((m_crlf & 1) != 0) {
      pcVar9 = "%s\r\n";
    }
    pcVar7 = dynamic_string::get_ptr((dynamic_string *)local_1060);
    data_stream::printf(this_00,pcVar9,pcVar7);
    (*m_pLog_stream->_vptr_data_stream[7])();
    dynamic_string::~dynamic_string((dynamic_string *)local_1060);
  }
  scoped_mutex::~scoped_mutex((scoped_mutex *)(buf + 0xff8));
  return extraout_EAX;
}

Assistant:

void console::vprintf(eConsoleMessageType type, const char* p, va_list args) {
  init();

  scoped_mutex lock(*m_pMutex);

  m_num_messages[type]++;

  char buf[cConsoleBufSize];
  vsprintf_s(buf, cConsoleBufSize, p, args);

  bool handled = false;

  if (m_output_funcs.size()) {
    for (uint i = 0; i < m_output_funcs.size(); i++)
      if (m_output_funcs[i].m_func(type, buf, m_output_funcs[i].m_pData))
        handled = true;
  }

  const char* pPrefix = NULL;
  if ((m_prefixes) && (m_at_beginning_of_line)) {
    switch (type) {
      case cDebugConsoleMessage:
        pPrefix = "Debug: ";
        break;
      case cWarningConsoleMessage:
        pPrefix = "Warning: ";
        break;
      case cErrorConsoleMessage:
        pPrefix = "Error: ";
        break;
      default:
        break;
    }
  }

  if ((!m_output_disabled) && (!handled)) {
    if (pPrefix)
      ::printf("%s", pPrefix);
    ::printf(m_crlf ? "%s\n" : "%s", buf);
  }

  uint n = strlen(buf);
  m_at_beginning_of_line = (m_crlf) || ((n) && (buf[n - 1] == '\n'));

  if ((type != cProgressConsoleMessage) && (m_pLog_stream)) {
    // Yes this is bad.
    dynamic_string tmp_buf(buf);

    tmp_buf.translate_lf_to_crlf();

    m_pLog_stream->printf(m_crlf ? "%s\r\n" : "%s", tmp_buf.get_ptr());
    m_pLog_stream->flush();
  }
}